

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerMixin.cpp
# Opt level: O1

TimerId __thiscall
Liby::TimerMixin::runAfter(TimerMixin *this,Timestamp *timestamp,BasicHandler *handler)

{
  TimerId TVar1;
  _Head_base<0UL,_Liby::EventQueue_*,_false> local_28;
  
  if (runAfter(Liby::Timestamp_const&,std::function<void()>const&)::helper == '\0') {
    runAfter();
  }
  EventLoop::runAfter((EventLoop *)&stack0xffffffffffffffd0,(Timestamp *)this->loop_,
                      (BasicHandler *)timestamp);
  TVar1 = runHelper(this,(TimerHolder *)&stack0xffffffffffffffd0);
  if ((_Head_base<0UL,_Liby::EventQueue_*,_false>)local_28._M_head_impl !=
      (_Head_base<0UL,_Liby::EventQueue_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl);
  }
  return TVar1;
}

Assistant:

TimerId TimerMixin::runAfter(const Timestamp &timestamp,
                             const BasicHandler &handler) {
    static TimerMixinHelper helper(&loop_);
    return runHelper(loop_->runAfter(timestamp, handler));
}